

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5Init(sqlite3 *db)

{
  int iVar1;
  sqlite3 *in_stack_00000020;
  
  iVar1 = fts5Init(in_stack_00000020);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts5Init(sqlite3 *db){
  return fts5Init(db);
}